

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O2

string * __thiscall
FastPForLib::FastBinaryPacking<8u>::name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,8);
  std::operator+(__return_storage_ptr__,"FastBinaryPacking",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    return "FastBinaryPacking" + std::to_string(MiniBlockSize);
  }